

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_check.cpp
# Opt level: O1

bool CheckTransaction(CTransaction *tx,TxValidationState *state)

{
  uint32_t *puVar1;
  uint uVar2;
  uint32_t uVar3;
  pointer pCVar4;
  long lVar5;
  pointer pCVar6;
  bool bVar7;
  uchar *puVar8;
  uint uVar9;
  byte unaff_BPL;
  pointer pCVar10;
  ulong uVar11;
  pointer pCVar12;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CTxIn *txin;
  long in_FS_OFFSET;
  bool bVar13;
  pair<std::_Rb_tree_iterator<COutPoint>,_bool> pVar14;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> vInOutPoints;
  string local_a8;
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Base_ptr local_68;
  size_t local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_88 = (undefined1  [8])(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bad-txns-vin-empty","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    unaff_BPL = ValidationState<TxValidationResult>::Invalid
                          (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                           (string *)local_88,&local_58);
  }
  else if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    local_88 = (undefined1  [8])(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bad-txns-vout-empty","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    unaff_BPL = ValidationState<TxValidationResult>::Invalid
                          (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                           (string *)local_88,&local_58);
  }
  else {
    local_80 = (undefined1  [8])&local_58;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_88 = (undefined1  [8])&TX_NO_WITNESS;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_88,&TX_NO_WITNESS);
    if ((ulong)((long)local_58._M_dataplus._M_p << 2) < 0x3d0901) {
      pCVar12 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar13 = pCVar12 == pCVar4;
      if (!bVar13) {
        uVar11 = 0;
        do {
          lVar5 = pCVar12->nValue;
          if (lVar5 < 0) {
            local_88 = (undefined1  [8])(local_80 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"bad-txns-vout-negative","");
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
            unaff_BPL = ValidationState<TxValidationResult>::Invalid
                                  (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                   (string *)local_88,&local_58);
LAB_00832ca4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (local_88 != (undefined1  [8])(local_80 + 8)) {
              operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
            }
            bVar7 = false;
          }
          else {
            if (2100000000000000 < lVar5) {
              local_88 = (undefined1  [8])(local_80 + 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_88,"bad-txns-vout-toolarge","");
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
              unaff_BPL = ValidationState<TxValidationResult>::Invalid
                                    (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                     (string *)local_88,&local_58);
              goto LAB_00832ca4;
            }
            uVar11 = uVar11 + lVar5;
            bVar7 = true;
            if (2100000000000000 < uVar11) {
              local_88 = (undefined1  [8])(local_80 + 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_88,"bad-txns-txouttotal-toolarge","");
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
              unaff_BPL = ValidationState<TxValidationResult>::Invalid
                                    (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                     (string *)local_88,&local_58);
              goto LAB_00832ca4;
            }
          }
          if (!bVar7) break;
          pCVar12 = pCVar12 + 1;
          bVar13 = pCVar12 == pCVar4;
        } while (!bVar13);
      }
      if (!bVar13) goto LAB_00832b1b;
      local_78._8_8_ = local_80;
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
      local_78._M_allocated_capacity = 0;
      local_60 = 0;
      pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_68 = (_Base_ptr)local_78._8_8_;
      for (pCVar10 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start; bVar13 = pCVar10 != pCVar6, bVar13;
          pCVar10 = pCVar10 + 1) {
        pVar14 = std::
                 _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                 ::_M_insert_unique<COutPoint_const&>
                           ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                             *)local_88,&pCVar10->prevout);
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"bad-txns-inputs-duplicate","");
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
          unaff_BPL = ValidationState<TxValidationResult>::Invalid
                                (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                 &local_58,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      }
      if (!bVar13) {
        bVar13 = CTransaction::IsCoinBase(tx);
        pCVar10 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (bVar13) {
          uVar2 = (pCVar10->scriptSig).super_CScriptBase._size;
          uVar9 = uVar2 - 0x1d;
          if (uVar2 < 0x1d) {
            uVar9 = uVar2;
          }
          if (uVar9 - 0x65 < 0xffffff9d) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"bad-cb-length","");
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
            unaff_BPL = ValidationState<TxValidationResult>::Invalid
                                  (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                   &local_58,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          else {
LAB_00832fa3:
            unaff_BPL = 1;
          }
        }
        else {
          pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          bVar13 = pCVar10 == pCVar6;
          if (!bVar13) {
            do {
              puVar1 = &(pCVar10->prevout).n;
              puVar8 = std::
                       __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                 (pCVar10,puVar1);
              uVar3 = *puVar1;
              if (uVar3 == 0xffffffff && (uint32_t *)puVar8 == puVar1) {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,"bad-txns-prevout-null","");
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
                unaff_BPL = ValidationState<TxValidationResult>::Invalid
                                      (&state->super_ValidationState<TxValidationResult>,
                                       TX_CONSENSUS,&local_58,&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
              }
              if (uVar3 == 0xffffffff && (uint32_t *)puVar8 == puVar1) break;
              pCVar10 = pCVar10 + 1;
              bVar13 = pCVar10 == pCVar6;
            } while (!bVar13);
          }
          if (bVar13) goto LAB_00832fa3;
        }
      }
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   *)local_88);
      goto LAB_00832b1b;
    }
    local_88 = (undefined1  [8])(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bad-txns-oversize","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    unaff_BPL = ValidationState<TxValidationResult>::Invalid
                          (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                           (string *)local_88,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != (undefined1  [8])(local_80 + 8)) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
LAB_00832b1b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool CheckTransaction(const CTransaction& tx, TxValidationState& state)
{
    // Basic checks that don't depend on any context
    if (tx.vin.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vin-empty");
    if (tx.vout.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-empty");
    // Size limits (this doesn't take the witness into account, as that hasn't been checked for malleability)
    if (::GetSerializeSize(TX_NO_WITNESS(tx)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-oversize");
    }

    // Check for negative or overflow output values (see CVE-2010-5139)
    CAmount nValueOut = 0;
    for (const auto& txout : tx.vout)
    {
        if (txout.nValue < 0)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-negative");
        if (txout.nValue > MAX_MONEY)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-toolarge");
        nValueOut += txout.nValue;
        if (!MoneyRange(nValueOut))
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-txouttotal-toolarge");
    }

    // Check for duplicate inputs (see CVE-2018-17144)
    // While Consensus::CheckTxInputs does check if all inputs of a tx are available, and UpdateCoins marks all inputs
    // of a tx as spent, it does not check if the tx has duplicate inputs.
    // Failure to run this check will result in either a crash or an inflation bug, depending on the implementation of
    // the underlying coins database.
    std::set<COutPoint> vInOutPoints;
    for (const auto& txin : tx.vin) {
        if (!vInOutPoints.insert(txin.prevout).second)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-inputs-duplicate");
    }

    if (tx.IsCoinBase())
    {
        if (tx.vin[0].scriptSig.size() < 2 || tx.vin[0].scriptSig.size() > 100)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-cb-length");
    }
    else
    {
        for (const auto& txin : tx.vin)
            if (txin.prevout.IsNull())
                return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-prevout-null");
    }

    return true;
}